

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

void __thiscall Timer::handleTick(Timer *this)

{
  uint uVar1;
  Node *pNVar2;
  TimerNode timer;
  AutoLock _auto_lock_;
  TimerNode local_68;
  AutoLock local_40;
  
  AutoLock::AutoLock(&local_40,&this->mMutex,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                     ,0xbb);
  this->mTicks = this->mTicks + 1;
  local_68.mEvent.mObj = (Event *)0x0;
  pNVar2 = ((this->mList).mHead)->next;
  if (pNVar2 != (this->mList).mTail) {
    do {
      SmartPtr<Event>::operator=(&local_68.mEvent,(pNVar2->val).mEvent.mObj);
      local_68.mDispatcher = (pNVar2->val).mDispatcher;
      local_68.mListener = (pNVar2->val).mListener;
      local_68.mPrivateData = (pNVar2->val).mPrivateData;
      local_68.mTick = (pNVar2->val).mTick;
      local_68.mRepeatMS = (pNVar2->val).mRepeatMS;
      local_68.mRemainingMS = (pNVar2->val).mRemainingMS;
      if (0 < (int)(local_68.mTick - this->mTicks)) break;
      JetHead::list<Timer::TimerNode>::pop_front(&this->mList);
      if (local_68.mEvent.mObj == (Event *)0x0) {
        (*(code *)**(undefined8 **)local_68.mListener)
                  (local_68.mListener,local_68._24_8_ & 0xffffffff);
      }
      else {
        (*(local_68.mDispatcher)->_vptr_IEventDispatcher[1])();
      }
      if (local_68.mRepeatMS == 0) {
        if (local_68.mEvent.mObj != (Event *)0x0) {
          RefCount::Release(&(local_68.mEvent.mObj)->super_RefCount);
        }
        local_68.mEvent.mObj = (Event *)0x0;
      }
      else {
        uVar1 = this->mMsPerTick;
        local_68.mTick =
             local_68.mTick + (~local_68.mRemainingMS + uVar1 + local_68.mRepeatMS) / uVar1;
        local_68.mRemainingMS = (local_68.mRemainingMS + local_68.mRepeatMS) % uVar1;
        addTimerNode(this,&local_68);
      }
      pNVar2 = ((this->mList).mHead)->next;
    } while (pNVar2 != (this->mList).mTail);
  }
  SmartPtr<Event>::~SmartPtr(&local_68.mEvent);
  AutoLock::~AutoLock(&local_40);
  return;
}

Assistant:

void Timer::handleTick()
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	DebugAutoLock( mMutex );
	
	mTicks++;
	
	TimerNode timer;
	
	while (not mList.empty())
	{
		timer = *mList.begin();
		
		int32_t diff = timer.mTick - mTicks;
		
		// List is sorted with nearest items first.  Once we find a node
		// that is in the future we are done.
		if ( diff > 0 )
			break;
		
		// Remove the timer from the list now
		mList.pop_front();

		// If the timer doesn't have an event then we call the listener
		if ( timer.mEvent == NULL )
		{
			timer.mListener->onTimeout( timer.mPrivateData );
		}
		// Otherwise send the event
		else
		{
			// Send the event to the specified dispatcher
			timer.mDispatcher->sendEvent( timer.mEvent );
		}
		
		// Check to see if this is a periodic timer.   If it is then
		// we need to re-calculate the tick value for the timer.  In
		// addition we are going to calculate the # of ms that are
		// lost by the tick calculation and accumulate them so that
		// over time we line up properly whenever possible.
		if (timer.mRepeatMS != 0)
		{
			unsigned newTicks = (timer.mRepeatMS + mMsPerTick - 1 - 
								 timer.mRemainingMS) / mMsPerTick;
			timer.mTick += newTicks;
			timer.mRemainingMS = (timer.mRepeatMS + timer.mRemainingMS) % 
				mMsPerTick;
			addTimerNode(timer);
		}
		// If this is a non-periodic then release our reference to
		// the event if we have one
		else
		{
			timer.mEvent = NULL;
		}
	}
}